

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uint __thiscall ON_SubDMeshFragmentIterator::FragmentCount(ON_SubDMeshFragmentIterator *this)

{
  uint uVar1;
  uint local_bc;
  uint local_b8;
  uint i;
  uint mesh_density;
  ON_SubDMeshFragment *local_a8;
  ON_SubDMeshFragment *fragment;
  uint local_98;
  uint half_size_fragment_count;
  uint full_size_fragment_count;
  uint side_count;
  ON_SubDMeshFragmentIterator frit;
  ON_SubDMeshFragmentIterator *this_local;
  
  if ((this->m_bHaveCounts & 1U) == 0) {
    frit._120_8_ = this;
    ON_SubDMeshFragmentIterator((ON_SubDMeshFragmentIterator *)&full_size_fragment_count,this);
    half_size_fragment_count = 0;
    local_98 = 0;
    fragment._4_4_ = 0;
    local_a8 = FirstFragment((ON_SubDMeshFragmentIterator *)&full_size_fragment_count);
    while (local_a8 != (ON_SubDMeshFragment *)0x0) {
      if (local_a8->m_face_fragment_count == 1) {
        local_98 = local_98 + 1;
        if (half_size_fragment_count == 0) {
          half_size_fragment_count = ON_SubDMeshFragmentGrid::SideSegmentCount(&local_a8->m_grid);
        }
      }
      else if ((1 < local_a8->m_face_fragment_count) &&
              (fragment._4_4_ = fragment._4_4_ + 1, half_size_fragment_count == 0)) {
        uVar1 = ON_SubDMeshFragmentGrid::SideSegmentCount(&local_a8->m_grid);
        half_size_fragment_count = uVar1 << 1;
      }
      local_a8 = NextFragment((ON_SubDMeshFragmentIterator *)&full_size_fragment_count);
    }
    local_b8 = 0;
    for (local_bc = 1; local_bc < half_size_fragment_count; local_bc = local_bc << 1) {
      local_b8 = local_b8 + 1;
    }
    this->m_maximum_mesh_density = local_b8;
    this->m_full_size_fragment_count = local_98;
    this->m_half_size_fragment_count = fragment._4_4_;
    this->m_bHaveCounts = true;
    ~ON_SubDMeshFragmentIterator((ON_SubDMeshFragmentIterator *)&full_size_fragment_count);
  }
  return this->m_full_size_fragment_count + this->m_half_size_fragment_count;
}

Assistant:

unsigned int ON_SubDMeshFragmentIterator::FragmentCount() const
{
  if ( false  == m_bHaveCounts )
  {
    // lazy evaluation of this value because it's frequently never used.
    ON_SubDMeshFragmentIterator frit(*this);
    unsigned int side_count = 0;
    unsigned int full_size_fragment_count = 0;
    unsigned int half_size_fragment_count = 0;
    for (const ON_SubDMeshFragment* fragment = frit.FirstFragment(); nullptr != fragment; fragment = frit.NextFragment())
    {
      if ( 1 == fragment->m_face_fragment_count )
      {
        ++full_size_fragment_count;
        if (0 == side_count)
          side_count = fragment->m_grid.SideSegmentCount();
      }
      else if (fragment->m_face_fragment_count > 1)
      {
        ++half_size_fragment_count;
        if (0 == side_count)
          side_count = 2*fragment->m_grid.SideSegmentCount();
      }
    }
    unsigned int mesh_density = 0;
    for (unsigned int i = 1; i < side_count; i *= 2)
      ++mesh_density;

    m_maximum_mesh_density = mesh_density;
    m_full_size_fragment_count = full_size_fragment_count;
    m_half_size_fragment_count = half_size_fragment_count;

    m_bHaveCounts = true;
  }
  return m_full_size_fragment_count + m_half_size_fragment_count;
}